

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O2

bool __thiscall
ON_Layer::CopyPerViewportSettings
          (ON_Layer *this,ON_Layer *source_layer,ON_UUID viewport_id,uint settings_mask)

{
  uint uVar1;
  bool bVar2;
  ON__LayerExtensions *pOVar3;
  ulong uVar4;
  ON__LayerPerViewSettings *pOVar5;
  ON__LayerPerViewSettings *pOVar6;
  undefined1 in_R9B;
  long lVar7;
  ulong uVar8;
  ON_UUID viewport_id_00;
  ON_UUID viewport_id_01;
  ON_UUID viewport_id_02;
  ON_UUID viewport_id_local;
  
  viewport_id_local.Data4 = viewport_id.Data4;
  viewport_id_local._0_8_ = viewport_id._0_8_;
  if (this != source_layer && settings_mask != 0) {
    bVar2 = ON_UuidIsNil(&viewport_id_local);
    if (bVar2) {
      uVar8 = 0;
      pOVar3 = ON__LayerExtensions::LayerExtensions
                         (source_layer,&source_layer->m_extension_bits,false);
      if (pOVar3 != (ON__LayerExtensions *)0x0) {
        uVar1 = (pOVar3->m_vp_settings).m_count;
        uVar4 = (ulong)uVar1;
        if ((int)uVar1 < 1) {
          uVar4 = uVar8;
        }
        for (lVar7 = 0; uVar4 * 0x28 - lVar7 != 0; lVar7 = lVar7 + 0x28) {
          pOVar6 = (pOVar3->m_vp_settings).m_a;
          viewport_id_00.Data4[0] = '\x01';
          viewport_id_00.Data4[1] = '\0';
          viewport_id_00.Data4[2] = '\0';
          viewport_id_00.Data4[3] = '\0';
          viewport_id_00.Data4[4] = '\0';
          viewport_id_00.Data4[5] = '\0';
          viewport_id_00.Data4[6] = '\0';
          viewport_id_00.Data4[7] = '\0';
          viewport_id_00._0_8_ = *(undefined8 *)((pOVar6->m_viewport_id).Data4 + lVar7);
          pOVar5 = ON__LayerExtensions::ViewportSettings
                             ((ON__LayerExtensions *)this,(ON_Layer *)&this->m_extension_bits,
                              *(uchar **)((pOVar6->m_viewport_id).Data4 + lVar7 + -8),viewport_id_00
                              ,(bool)in_R9B);
          if (pOVar5 != (ON__LayerPerViewSettings *)0x0) {
            ON__LayerPerViewSettings::CopySettings
                      (pOVar5,(ON__LayerPerViewSettings *)
                              ((pOVar6->m_viewport_id).Data4 + lVar7 + -8),settings_mask);
            uVar8 = 1;
          }
        }
      }
      goto LAB_004dcd73;
    }
    uVar8 = 0;
    viewport_id_01.Data4[0] = '\0';
    viewport_id_01.Data4[1] = '\0';
    viewport_id_01.Data4[2] = '\0';
    viewport_id_01.Data4[3] = '\0';
    viewport_id_01.Data4[4] = '\0';
    viewport_id_01.Data4[5] = '\0';
    viewport_id_01.Data4[6] = '\0';
    viewport_id_01.Data4[7] = '\0';
    viewport_id_01._0_8_ = viewport_id_local.Data4;
    pOVar6 = ON__LayerExtensions::ViewportSettings
                       ((ON__LayerExtensions *)source_layer,
                        (ON_Layer *)&source_layer->m_extension_bits,(uchar *)viewport_id_local._0_8_
                        ,viewport_id_01,(bool)in_R9B);
    if (pOVar6 == (ON__LayerPerViewSettings *)0x0) goto LAB_004dcd73;
    viewport_id_02.Data4[0] = '\x01';
    viewport_id_02.Data4[1] = '\0';
    viewport_id_02.Data4[2] = '\0';
    viewport_id_02.Data4[3] = '\0';
    viewport_id_02.Data4[4] = '\0';
    viewport_id_02.Data4[5] = '\0';
    viewport_id_02.Data4[6] = '\0';
    viewport_id_02.Data4[7] = '\0';
    viewport_id_02._0_8_ = viewport_id_local.Data4;
    pOVar5 = ON__LayerExtensions::ViewportSettings
                       ((ON__LayerExtensions *)this,(ON_Layer *)&this->m_extension_bits,
                        (uchar *)viewport_id_local._0_8_,viewport_id_02,(bool)in_R9B);
    if (pOVar5 != (ON__LayerPerViewSettings *)0x0) {
      ON__LayerPerViewSettings::CopySettings(pOVar5,pOVar6,settings_mask);
      uVar8 = 1;
      goto LAB_004dcd73;
    }
  }
  uVar8 = 0;
LAB_004dcd73:
  return SUB81(uVar8,0);
}

Assistant:

bool ON_Layer::CopyPerViewportSettings( 
    const ON_Layer& source_layer,
    ON_UUID viewport_id,
    unsigned int settings_mask
    )
{
  bool rc = false;
  if ( 0 != settings_mask && this != &source_layer )
  {
    if ( ON_UuidIsNil(viewport_id) )
    {
      // copy per viewport settings for every viewport
      const ON__LayerExtensions* soruce_layer_ud = ON__LayerExtensions::LayerExtensions(source_layer,&source_layer.m_extension_bits,false);
      if ( 0 != soruce_layer_ud )
      {
        const int count = soruce_layer_ud->m_vp_settings.Count();
        for ( int i = 0; i < count; i++ )
        {
          const ON__LayerPerViewSettings& src = soruce_layer_ud->m_vp_settings[i];
          ON__LayerPerViewSettings* dst = ON__LayerExtensions::ViewportSettings( *this, &m_extension_bits, src.m_viewport_id, true);
          if ( 0 != dst )
          {
            dst->CopySettings(&src,settings_mask);
            rc = true;
          }
        }
      }
    }
    else
    {
      // copy per viewport settings for a specified viewport.
      const ON__LayerPerViewSettings* src = ON__LayerExtensions::ViewportSettings( source_layer, &source_layer.m_extension_bits, viewport_id, false);
      if ( 0 != src )
      {
        ON__LayerPerViewSettings* dst = ON__LayerExtensions::ViewportSettings( *this, &m_extension_bits, viewport_id, true);
        if ( 0 != dst )
        {
          dst->CopySettings(src,settings_mask);
          rc = true;
        }
      }
    }
  }
  return rc;
}